

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void releaseAllSavepoints(Pager *pPager)

{
  long in_RDI;
  int ii;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0x80); iVar1 = iVar1 + 1) {
    sqlite3BitvecDestroy((Bitvec *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  }
  if (*(char *)(in_RDI + 8) != '\0') {
    iVar1 = sqlite3JournalIsInMemory(*(sqlite3_file **)(in_RDI + 0x58));
    if (iVar1 == 0) goto LAB_001649d1;
  }
  sqlite3OsClose((sqlite3_file *)0x1649d1);
LAB_001649d1:
  sqlite3_free((void *)0x1649df);
  *(undefined8 *)(in_RDI + 0x78) = 0;
  *(undefined4 *)(in_RDI + 0x80) = 0;
  *(undefined4 *)(in_RDI + 0x3c) = 0;
  return;
}

Assistant:

static void releaseAllSavepoints(Pager *pPager){
  int ii;               /* Iterator for looping through Pager.aSavepoint */
  for(ii=0; ii<pPager->nSavepoint; ii++){
    sqlite3BitvecDestroy(pPager->aSavepoint[ii].pInSavepoint);
  }
  if( !pPager->exclusiveMode || sqlite3JournalIsInMemory(pPager->sjfd) ){
    sqlite3OsClose(pPager->sjfd);
  }
  sqlite3_free(pPager->aSavepoint);
  pPager->aSavepoint = 0;
  pPager->nSavepoint = 0;
  pPager->nSubRec = 0;
}